

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  Rep *pRVar2;
  string *psVar3;
  bool bVar4;
  UniDirectionalLSTMLayerParams *pUVar5;
  void **ppvVar6;
  LSTMParams *pLVar7;
  uint64_t uVar8;
  WeightParams *pWVar9;
  long lVar10;
  LSTMWeightParams *pLVar11;
  allocator local_16a;
  allocator local_169;
  uint64_t local_168;
  string local_160;
  string local_140;
  string err;
  Result r;
  UniDirectionalLSTMLayerParams recurrent;
  LSTMParams local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&recurrent,layer,1,3);
  Result::operator=(&r,(Result *)&recurrent);
  std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
  bVar4 = Result::good(&r);
  if (bVar4) {
    validateOutputCount((Result *)&recurrent,layer,3,3);
    Result::operator=(&r,(Result *)&recurrent);
    std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
  }
  bVar4 = Result::good(&r);
  if ((bVar4) && (bVar4 = Result::good(&r), bVar4)) {
    if (this->ndArrayInterpretation == true) {
      std::__cxx11::string::string((string *)&local_50,"UniDirectionalLSTM",(allocator *)&err);
      validateInputOutputRankEquality((Result *)&recurrent,layer,&local_50,&this->blobNameToRank);
      Result::operator=(&r,(Result *)&recurrent);
      std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
      std::__cxx11::string::~string((string *)&local_50);
      bVar4 = Result::good(&r);
      if (bVar4) {
        std::__cxx11::string::string((string *)&err,"UniDirectionalLSTM",(allocator *)&local_160);
        validateRankCount((Result *)&recurrent,layer,&err,5,5,&this->blobNameToRank);
        Result::operator=(&r,(Result *)&recurrent);
        std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
        std::__cxx11::string::~string((string *)&err);
        bVar4 = Result::good(&r);
        if (bVar4) goto LAB_0024b86a;
      }
    }
    else {
LAB_0024b86a:
      pUVar5 = Specification::NeuralNetworkLayer::unidirectionallstm(layer);
      pRVar2 = (pUVar5->activations_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      iVar1 = (pUVar5->activations_).super_RepeatedPtrFieldBase.current_size_;
      lVar10 = 0;
      do {
        if ((long)iVar1 * 8 == lVar10) break;
        validateRecurrentActivationParams
                  ((Result *)&recurrent,*(ActivationParams **)((long)ppvVar6 + lVar10));
        Result::operator=(&r,(Result *)&recurrent);
        std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
        bVar4 = Result::good(&r);
        lVar10 = lVar10 + 8;
      } while (bVar4);
      pUVar5 = Specification::NeuralNetworkLayer::unidirectionallstm(layer);
      pLVar11 = pUVar5->weightparams_;
      if (pLVar11 == (LSTMWeightParams *)0x0) {
        pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
      }
      pUVar5 = Specification::NeuralNetworkLayer::unidirectionallstm(layer);
      pLVar7 = pUVar5->params_;
      if (pLVar7 == (LSTMParams *)0x0) {
        pLVar7 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
      }
      Specification::LSTMParams::LSTMParams(&local_70,pLVar7);
      validateLSTMWeightParams((Result *)&recurrent,pLVar11,&local_70);
      Result::operator=(&r,(Result *)&recurrent);
      std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
      Specification::LSTMParams::~LSTMParams(&local_70);
      bVar4 = Result::good(&r);
      if (bVar4) {
        pUVar5 = Specification::NeuralNetworkLayer::unidirectionallstm(layer);
        Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
                  (&recurrent,pUVar5);
        if (recurrent.activations_.super_RepeatedPtrFieldBase.current_size_ == 3) {
          pLVar11 = recurrent.weightparams_;
          if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
            pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
          }
          local_168 = recurrent.outputvectorsize_;
          pWVar9 = pLVar11->inputgateweightmatrix_;
          if (pWVar9 == (WeightParams *)0x0) {
            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          uVar8 = recurrent.inputvectorsize_ * recurrent.outputvectorsize_;
          std::__cxx11::string::string((string *)&local_160,"Unidirectional LSTM",&local_169);
          psVar3 = (layer->name_).ptr_;
          std::__cxx11::string::string((string *)&local_140,"input gate weight matrix",&local_16a);
          validateGeneralWeightParams
                    ((Result *)&err,pWVar9,uVar8,local_168,&local_160,psVar3,&local_140);
          Result::operator=(&r,(Result *)&err);
          std::__cxx11::string::~string((string *)&err._M_string_length);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          bVar4 = Result::good(&r);
          if (bVar4) {
            pLVar11 = recurrent.weightparams_;
            if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
              pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
            }
            pWVar9 = pLVar11->forgetgateweightmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            std::__cxx11::string::string((string *)&local_160,"Unidirectional LSTM",&local_169);
            psVar3 = (layer->name_).ptr_;
            std::__cxx11::string::string
                      ((string *)&local_140,"forget gate weight matrix",&local_16a);
            validateGeneralWeightParams
                      ((Result *)&err,pWVar9,uVar8,local_168,&local_160,psVar3,&local_140);
            Result::operator=(&r,(Result *)&err);
            std::__cxx11::string::~string((string *)&err._M_string_length);
            std::__cxx11::string::~string((string *)&local_140);
            std::__cxx11::string::~string((string *)&local_160);
            bVar4 = Result::good(&r);
            if (bVar4) {
              pLVar11 = recurrent.weightparams_;
              if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
              }
              pWVar9 = pLVar11->blockinputweightmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string((string *)&local_160,"Unidirectional LSTM",&local_169);
              psVar3 = (layer->name_).ptr_;
              std::__cxx11::string::string
                        ((string *)&local_140,"block input gate weight matrix",&local_16a);
              validateGeneralWeightParams
                        ((Result *)&err,pWVar9,uVar8,local_168,&local_160,psVar3,&local_140);
              Result::operator=(&r,(Result *)&err);
              std::__cxx11::string::~string((string *)&err._M_string_length);
              std::__cxx11::string::~string((string *)&local_140);
              std::__cxx11::string::~string((string *)&local_160);
              bVar4 = Result::good(&r);
              if (bVar4) {
                pLVar11 = recurrent.weightparams_;
                if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                  pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
                }
                pWVar9 = pLVar11->outputgateweightmatrix_;
                if (pWVar9 == (WeightParams *)0x0) {
                  pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                std::__cxx11::string::string((string *)&local_160,"Unidirectional LSTM",&local_169);
                psVar3 = (layer->name_).ptr_;
                std::__cxx11::string::string
                          ((string *)&local_140,"output gate weight matrix",&local_16a);
                validateGeneralWeightParams
                          ((Result *)&err,pWVar9,uVar8,local_168,&local_160,psVar3,&local_140);
                Result::operator=(&r,(Result *)&err);
                std::__cxx11::string::~string((string *)&err._M_string_length);
                std::__cxx11::string::~string((string *)&local_140);
                std::__cxx11::string::~string((string *)&local_160);
                bVar4 = Result::good(&r);
                if (bVar4) {
                  pLVar11 = recurrent.weightparams_;
                  if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                    pLVar11 = (LSTMWeightParams *)
                              &Specification::_LSTMWeightParams_default_instance_;
                  }
                  pWVar9 = pLVar11->inputgaterecursionmatrix_;
                  if (pWVar9 == (WeightParams *)0x0) {
                    pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  std::__cxx11::string::string
                            ((string *)&local_160,"Unidirectional LSTM",&local_169);
                  psVar3 = (layer->name_).ptr_;
                  std::__cxx11::string::string
                            ((string *)&local_140,"input gate recursion matrix",&local_16a);
                  uVar8 = local_168 * local_168;
                  validateGeneralWeightParams
                            ((Result *)&err,pWVar9,uVar8,local_168,&local_160,psVar3,&local_140);
                  Result::operator=(&r,(Result *)&err);
                  std::__cxx11::string::~string((string *)&err._M_string_length);
                  std::__cxx11::string::~string((string *)&local_140);
                  std::__cxx11::string::~string((string *)&local_160);
                  bVar4 = Result::good(&r);
                  if (bVar4) {
                    pLVar11 = recurrent.weightparams_;
                    if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                      pLVar11 = (LSTMWeightParams *)
                                &Specification::_LSTMWeightParams_default_instance_;
                    }
                    pWVar9 = pLVar11->forgetgaterecursionmatrix_;
                    if (pWVar9 == (WeightParams *)0x0) {
                      pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                    }
                    std::__cxx11::string::string
                              ((string *)&local_160,"Unidirectional LSTM",&local_169);
                    psVar3 = (layer->name_).ptr_;
                    std::__cxx11::string::string
                              ((string *)&local_140,"forget gate recursion matrix",&local_16a);
                    validateGeneralWeightParams
                              ((Result *)&err,pWVar9,uVar8,local_168,&local_160,psVar3,&local_140);
                    Result::operator=(&r,(Result *)&err);
                    std::__cxx11::string::~string((string *)&err._M_string_length);
                    std::__cxx11::string::~string((string *)&local_140);
                    std::__cxx11::string::~string((string *)&local_160);
                    bVar4 = Result::good(&r);
                    if (bVar4) {
                      pLVar11 = recurrent.weightparams_;
                      if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                        pLVar11 = (LSTMWeightParams *)
                                  &Specification::_LSTMWeightParams_default_instance_;
                      }
                      pWVar9 = pLVar11->blockinputrecursionmatrix_;
                      if (pWVar9 == (WeightParams *)0x0) {
                        pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                      }
                      std::__cxx11::string::string
                                ((string *)&local_160,"Unidirectional LSTM",&local_169);
                      psVar3 = (layer->name_).ptr_;
                      std::__cxx11::string::string
                                ((string *)&local_140,"block input gate recursion matrix",&local_16a
                                );
                      validateGeneralWeightParams
                                ((Result *)&err,pWVar9,uVar8,local_168,&local_160,psVar3,&local_140)
                      ;
                      Result::operator=(&r,(Result *)&err);
                      std::__cxx11::string::~string((string *)&err._M_string_length);
                      std::__cxx11::string::~string((string *)&local_140);
                      std::__cxx11::string::~string((string *)&local_160);
                      bVar4 = Result::good(&r);
                      if (bVar4) {
                        pLVar11 = recurrent.weightparams_;
                        if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                          pLVar11 = (LSTMWeightParams *)
                                    &Specification::_LSTMWeightParams_default_instance_;
                        }
                        pWVar9 = pLVar11->outputgaterecursionmatrix_;
                        if (pWVar9 == (WeightParams *)0x0) {
                          pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                        }
                        std::__cxx11::string::string
                                  ((string *)&local_160,"Unidirectional LSTM",&local_169);
                        psVar3 = (layer->name_).ptr_;
                        std::__cxx11::string::string
                                  ((string *)&local_140,"output gate recursion matrix",&local_16a);
                        validateGeneralWeightParams
                                  ((Result *)&err,pWVar9,uVar8,local_168,&local_160,psVar3,
                                   &local_140);
                        Result::operator=(&r,(Result *)&err);
                        std::__cxx11::string::~string((string *)&err._M_string_length);
                        std::__cxx11::string::~string((string *)&local_140);
                        std::__cxx11::string::~string((string *)&local_160);
                        bVar4 = Result::good(&r);
                        if (bVar4) {
                          pLVar7 = recurrent.params_;
                          if (recurrent.params_ == (LSTMParams *)0x0) {
                            pLVar7 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
                          }
                          if (pLVar7->hasbiasvectors_ == true) {
                            pLVar11 = recurrent.weightparams_;
                            if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                              pLVar11 = (LSTMWeightParams *)
                                        &Specification::_LSTMWeightParams_default_instance_;
                            }
                            pWVar9 = pLVar11->inputgatebiasvector_;
                            if (pWVar9 == (WeightParams *)0x0) {
                              pWVar9 = (WeightParams *)
                                       &Specification::_WeightParams_default_instance_;
                            }
                            std::__cxx11::string::string
                                      ((string *)&local_160,"Unidirectional LSTM",&local_169);
                            psVar3 = (layer->name_).ptr_;
                            std::__cxx11::string::string
                                      ((string *)&local_140,"input gate bias vector",&local_16a);
                            validateGeneralWeightParams
                                      ((Result *)&err,pWVar9,local_168,1,&local_160,psVar3,
                                       &local_140);
                            Result::operator=(&r,(Result *)&err);
                            std::__cxx11::string::~string((string *)&err._M_string_length);
                            std::__cxx11::string::~string((string *)&local_140);
                            std::__cxx11::string::~string((string *)&local_160);
                            bVar4 = Result::good(&r);
                            if (bVar4) {
                              pLVar11 = recurrent.weightparams_;
                              if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                                pLVar11 = (LSTMWeightParams *)
                                          &Specification::_LSTMWeightParams_default_instance_;
                              }
                              pWVar9 = pLVar11->forgetgatebiasvector_;
                              if (pWVar9 == (WeightParams *)0x0) {
                                pWVar9 = (WeightParams *)
                                         &Specification::_WeightParams_default_instance_;
                              }
                              std::__cxx11::string::string
                                        ((string *)&local_160,"Unidirectional LSTM",&local_169);
                              psVar3 = (layer->name_).ptr_;
                              std::__cxx11::string::string
                                        ((string *)&local_140,"forget gate bias vector",&local_16a);
                              validateGeneralWeightParams
                                        ((Result *)&err,pWVar9,local_168,1,&local_160,psVar3,
                                         &local_140);
                              Result::operator=(&r,(Result *)&err);
                              std::__cxx11::string::~string((string *)&err._M_string_length);
                              std::__cxx11::string::~string((string *)&local_140);
                              std::__cxx11::string::~string((string *)&local_160);
                              bVar4 = Result::good(&r);
                              if (bVar4) {
                                pLVar11 = recurrent.weightparams_;
                                if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                                  pLVar11 = (LSTMWeightParams *)
                                            &Specification::_LSTMWeightParams_default_instance_;
                                }
                                pWVar9 = pLVar11->blockinputbiasvector_;
                                if (pWVar9 == (WeightParams *)0x0) {
                                  pWVar9 = (WeightParams *)
                                           &Specification::_WeightParams_default_instance_;
                                }
                                std::__cxx11::string::string
                                          ((string *)&local_160,"Unidirectional LSTM",&local_169);
                                psVar3 = (layer->name_).ptr_;
                                std::__cxx11::string::string
                                          ((string *)&local_140,"block input bias vector",&local_16a
                                          );
                                validateGeneralWeightParams
                                          ((Result *)&err,pWVar9,local_168,1,&local_160,psVar3,
                                           &local_140);
                                Result::operator=(&r,(Result *)&err);
                                std::__cxx11::string::~string((string *)&err._M_string_length);
                                std::__cxx11::string::~string((string *)&local_140);
                                std::__cxx11::string::~string((string *)&local_160);
                                bVar4 = Result::good(&r);
                                if (bVar4) {
                                  pLVar11 = recurrent.weightparams_;
                                  if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                                    pLVar11 = (LSTMWeightParams *)
                                              &Specification::_LSTMWeightParams_default_instance_;
                                  }
                                  pWVar9 = pLVar11->outputgatebiasvector_;
                                  if (pWVar9 == (WeightParams *)0x0) {
                                    pWVar9 = (WeightParams *)
                                             &Specification::_WeightParams_default_instance_;
                                  }
                                  std::__cxx11::string::string
                                            ((string *)&local_160,"Unidirectional LSTM",&local_169);
                                  psVar3 = (layer->name_).ptr_;
                                  std::__cxx11::string::string
                                            ((string *)&local_140,"output gate bias vector",
                                             &local_16a);
                                  validateGeneralWeightParams
                                            ((Result *)&err,pWVar9,local_168,1,&local_160,psVar3,
                                             &local_140);
                                  Result::operator=(&r,(Result *)&err);
                                  std::__cxx11::string::~string((string *)&err._M_string_length);
                                  std::__cxx11::string::~string((string *)&local_140);
                                  std::__cxx11::string::~string((string *)&local_160);
                                  bVar4 = Result::good(&r);
                                  if (bVar4) goto LAB_0024c2e8;
                                }
                              }
                            }
                          }
                          else {
LAB_0024c2e8:
                            if (recurrent.params_ == (LSTMParams *)0x0) {
                              recurrent.params_ =
                                   (LSTMParams *)&Specification::_LSTMParams_default_instance_;
                            }
                            if ((recurrent.params_)->haspeepholevectors_ == true) {
                              pLVar11 = recurrent.weightparams_;
                              if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                                pLVar11 = (LSTMWeightParams *)
                                          &Specification::_LSTMWeightParams_default_instance_;
                              }
                              pWVar9 = pLVar11->inputgatepeepholevector_;
                              if (pWVar9 == (WeightParams *)0x0) {
                                pWVar9 = (WeightParams *)
                                         &Specification::_WeightParams_default_instance_;
                              }
                              std::__cxx11::string::string
                                        ((string *)&local_160,"Unidirectional LSTM",&local_169);
                              psVar3 = (layer->name_).ptr_;
                              std::__cxx11::string::string
                                        ((string *)&local_140,"input gate peep hole vector",
                                         &local_16a);
                              validateGeneralWeightParams
                                        ((Result *)&err,pWVar9,local_168,1,&local_160,psVar3,
                                         &local_140);
                              Result::operator=(&r,(Result *)&err);
                              std::__cxx11::string::~string((string *)&err._M_string_length);
                              std::__cxx11::string::~string((string *)&local_140);
                              std::__cxx11::string::~string((string *)&local_160);
                              bVar4 = Result::good(&r);
                              if (bVar4) {
                                pLVar11 = recurrent.weightparams_;
                                if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                                  pLVar11 = (LSTMWeightParams *)
                                            &Specification::_LSTMWeightParams_default_instance_;
                                }
                                pWVar9 = pLVar11->forgetgatepeepholevector_;
                                if (pWVar9 == (WeightParams *)0x0) {
                                  pWVar9 = (WeightParams *)
                                           &Specification::_WeightParams_default_instance_;
                                }
                                std::__cxx11::string::string
                                          ((string *)&local_160,"Unidirectional LSTM",&local_169);
                                psVar3 = (layer->name_).ptr_;
                                std::__cxx11::string::string
                                          ((string *)&local_140,"forget gate peep hole vector",
                                           &local_16a);
                                validateGeneralWeightParams
                                          ((Result *)&err,pWVar9,local_168,1,&local_160,psVar3,
                                           &local_140);
                                Result::operator=(&r,(Result *)&err);
                                std::__cxx11::string::~string((string *)&err._M_string_length);
                                std::__cxx11::string::~string((string *)&local_140);
                                std::__cxx11::string::~string((string *)&local_160);
                                bVar4 = Result::good(&r);
                                if (bVar4) {
                                  if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                                    recurrent.weightparams_ =
                                         (LSTMWeightParams *)
                                         &Specification::_LSTMWeightParams_default_instance_;
                                  }
                                  pWVar9 = (recurrent.weightparams_)->outputgatepeepholevector_;
                                  if (pWVar9 == (WeightParams *)0x0) {
                                    pWVar9 = (WeightParams *)
                                             &Specification::_WeightParams_default_instance_;
                                  }
                                  std::__cxx11::string::string
                                            ((string *)&local_160,"Unidirectional LSTM",&local_169);
                                  psVar3 = (layer->name_).ptr_;
                                  std::__cxx11::string::string
                                            ((string *)&local_140,"output gate peep hole vector",
                                             &local_16a);
                                  validateGeneralWeightParams
                                            ((Result *)&err,pWVar9,local_168,1,&local_160,psVar3,
                                             &local_140);
                                  Result::operator=(&r,(Result *)&err);
                                  std::__cxx11::string::~string((string *)&err._M_string_length);
                                  std::__cxx11::string::~string((string *)&local_140);
                                  std::__cxx11::string::~string((string *)&local_160);
                                  Result::good(&r);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          Result::Result(__return_storage_ptr__,&r);
        }
        else {
          std::operator+(&local_160,"Unidirectional LSTM layer:",(layer->name_).ptr_);
          std::operator+(&err,&local_160," must provide 3 activations");
          std::__cxx11::string::~string((string *)&local_160);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
          std::__cxx11::string::~string((string *)&err);
        }
        Specification::UniDirectionalLSTMLayerParams::~UniDirectionalLSTMLayerParams(&recurrent);
        goto LAB_0024c569;
      }
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_0024c569:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // Must specify hidden states
    r = validateInputCount(layer, 1, 3);
    if (r.good()) {
        r = validateOutputCount(layer, 3, 3);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "UniDirectionalLSTM", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "UniDirectionalLSTM", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    for (const auto& activation : layer.unidirectionallstm().activations()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    r = validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params());
    if (!r.good()) {
        return r;
    }

    Specification::UniDirectionalLSTMLayerParams recurrent = layer.unidirectionallstm();
    uint64_t x = recurrent.inputvectorsize();
    uint64_t h = recurrent.outputvectorsize();

    if (recurrent.activations_size() != 3){
        const std::string err = std::string("Unidirectional LSTM layer:" + layer.name() + " must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check weight matrices' sizes
    r = validateGeneralWeightParams(recurrent.weightparams().inputgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().forgetgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "forget gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().blockinputweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "block input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().outputgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "output gate weight matrix");
    if(!r.good()) return r;
    // Check recursion matrices' sizes
    r = validateGeneralWeightParams(recurrent.weightparams().inputgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().forgetgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "forget gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().blockinputrecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "block input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().outputgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "output gate recursion matrix");
    if(!r.good()) return r;
    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        r = validateGeneralWeightParams(recurrent.weightparams().inputgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "input gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().forgetgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "forget gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().blockinputbiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "block input bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().outputgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "output gate bias vector");
        if(!r.good()) return r;
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        r = validateGeneralWeightParams(recurrent.weightparams().inputgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "input gate peep hole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().forgetgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "forget gate peep hole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().outputgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "output gate peep hole vector");
        if(!r.good()) return r;
    }

    return r;
}